

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O2

bool __thiscall Confparse::WriteStr(Confparse *this,char *key,char *value)

{
  byte *__haystack;
  byte *pbVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  path *this_00;
  byte *pbVar6;
  path nfn;
  ofstream file;
  char buf [1024];
  
  __haystack = (byte *)this->conf;
  if (__haystack != (byte *)0x0) {
    if (key == (char *)0x0) {
      return false;
    }
    if (value == (char *)0x0) {
      return false;
    }
    if ((this->filepath)._M_pathname._M_string_length == 0) {
      return false;
    }
    sVar4 = strlen(key);
    if ((int)sVar4 != 0) {
      pbVar5 = (byte *)strstr((char *)__haystack,key);
      if (pbVar5 != (byte *)0x0) {
        pbVar1 = (byte *)this->limit;
        do {
          if ((pbVar5 == (byte *)0x0) || (pbVar1 <= pbVar5)) {
            std::ofstream::ofstream(&file);
            std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                      (&file,&this->filepath,_S_out|_S_bin|_S_app);
            cVar2 = std::__basic_file<char>::is_open();
            if (cVar2 != '\0') {
              snprintf(buf,0x2800,"%s = %s\r\n",key,value);
              strlen(buf);
              std::ostream::write((char *)&file,(long)buf);
              std::ostream::flush();
              std::ofstream::close();
              Load(this,&this->filepath,false);
            }
            std::ofstream::~ofstream(&file);
            return (bool)cVar2;
          }
          pbVar6 = pbVar5 + (int)sVar4;
          if ((pbVar6 < pbVar1) && (iVar3 = isalnum((int)(char)*pbVar6), iVar3 == 0)) {
            for (; pbVar6 < pbVar1; pbVar6 = pbVar6 + 1) {
              if ((0x3d < (ulong)*pbVar6) ||
                 ((0x2000000100000200U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) {
                if ((__haystack <= pbVar6) &&
                   (((pbVar5 == __haystack || (pbVar5[-1] == 0xd)) || (pbVar5[-1] == 10))))
                goto LAB_0010bb92;
                break;
              }
            }
          }
          pbVar5 = (byte *)strstr((char *)(pbVar5 + 1),key);
        } while( true );
      }
      std::filesystem::__cxx11::path::path(&nfn,&this->filepath);
      std::filesystem::__cxx11::path::operator+=(&nfn,"~");
      std::ofstream::ofstream(&file);
      std::filesystem::rename(&this->filepath,&nfn);
      std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                (&file,&this->filepath,_S_trunc|_S_out|_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::ostream::write((char *)&file,(long)this->conf);
        snprintf(buf,0x400,"\r\n%s = %s",key,value);
        std::ostream::write((char *)&file,(long)buf);
        std::ostream::flush();
        std::ofstream::close();
        Load(this,&this->filepath,false);
      }
      std::ofstream::~ofstream(&file);
      this_00 = &nfn;
      goto LAB_0010bd42;
    }
  }
  return false;
LAB_0010bb92:
  while ((pbVar6 < pbVar1 && ((0xd < *pbVar6 || ((0x2401U >> (*pbVar6 & 0x1f) & 1) == 0))))) {
    pbVar6 = pbVar6 + 1;
  }
  std::filesystem::__cxx11::path::path((path *)&file,&this->filepath);
  std::filesystem::__cxx11::path::operator+=((path *)&file,"~");
  std::ofstream::ofstream(buf);
  std::filesystem::rename(&this->filepath,(path *)&file);
  std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)buf,&this->filepath,
             _S_trunc|_S_out|_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    std::ostream::write(buf,(long)this->conf);
    strlen(value);
    std::ostream::write(buf,(long)value);
    std::ostream::write(buf,(long)pbVar6);
    std::ofstream::close();
    Load(this,&this->filepath,false);
  }
  std::ofstream::~ofstream(buf);
  this_00 = (path *)&file;
LAB_0010bd42:
  std::filesystem::__cxx11::path::~path(this_00);
  return (bool)cVar2;
}

Assistant:

bool Confparse::WriteStr(const char *key, const char *value) {
	char *p, *op;
	char *llimit;
	int keylen;

	if (!conf) return false;
	if (filepath.empty()) return false;
	if (!value) return false;
	if (!key) return false;

	keylen = strlen(key);
	if (keylen == 0) return false;
	op = p = strstr(conf, key);
	if (p == NULL) {
		char buf[1024];
		size_t bs;
		auto nfn = filepath;
		nfn += "~";
		ofstream file;

		filesystem::rename(filepath, nfn);
		file.open(filepath, std::ios::out | std::ios::binary | std::ios::trunc);
		if (!file.is_open()) {
			return false;
		}
		file.write(conf, buffer_size); // write the leadup
		bs = snprintf(buf, sizeof(buf), "\r\n%s = %s", key, value);
		file.write(buf, bs);
		file.flush();
		file.close();

		Load(filepath);
		return true;
	}

	//	llimit = limit - keylen - 2; // allows for up to 'key=x'
	llimit = limit;
	while (p && p < llimit) {

		/*
		 * Consume the name<whitespace>=<whitespace> trash before we
		 * get to the actual value.  While this does mean things are
		 * slightly less strict in the configuration file text it can
		 * assist in making it easier for people to read it.
		 */
		p = p + keylen;
		if ((p < llimit) && (!isalnum(*p))) {

			while ((p < llimit) && ((*p == '=') || (*p == ' ') || (*p == '\t'))) {
				p++; // get up to the start of the value;
			}

			if ((p < llimit) && (p >= conf)) {

				/*
				 * Check that the location of the strstr() return is
				 * left aligned to the start of the line. This prevents
				 * us picking up trash name=value pairs among the general
				 * text within the file
				 */
				if ((op == conf) || (*(op - 1) == '\r') || (*(op - 1) == '\n')) {
					char *ep = NULL;

					/*
					 * op represents the start of the line/key.
					 * p represents the start of the value.
					 *
					 * we can just dump out to the file up to p and then
					 * print our data
					 */

					/*
					 * Search for the end of the data by finding the end of the line
					 * This will become 'ep', which we'll use as the start of the
					 * rest of the file data we dump back to the config.
					 */
					ep = p;
					while ((ep < limit) && ((*ep != '\0') && (*ep != '\n') && (*ep != '\r'))) {
						ep++;
					}

					{
						auto nfn = filepath;
						nfn += "~";
						ofstream file;

						filesystem::rename(filepath, nfn);
						file.open(filepath, std::ios::out | std::ios::binary | std::ios::trunc);
						if (!file.is_open()) {
							return false;
						}
						file.write(conf, (p - conf));     // write the leadup
						file.write(value, strlen(value)); // write the new data
						file.write(ep, limit - ep);       // write the rest of the file
						file.close();

						Load(filepath);
						return true;
					}
				}
			}
		}
		p  = strstr(op + 1, key);
		op = p;
	}

	/*
	 * If we didn't find our parameter in the config file, then add it.
	 */
	{
		char sep[CONFPARSE_MAX_VALUE_SIZE];
		ofstream file;
		file.open(filepath, std::ios::out | std::ios::binary | std::ios::app);
		if (!file.is_open()) {
			return false;
		}
		snprintf(sep, sizeof(sep), "%s = %s\r\n", key, value);
		file.write(sep, strlen(sep));
		file.flush();
		file.close();

		Load(filepath);
		return true;
	}

	return false;
}